

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_enum<binlog::ToStringVisitor,binlog::Range>
               (string_view tag,ToStringVisitor *visitor,Range *istream)

{
  Enum e;
  bool bVar1;
  runtime_error *this;
  const_reference pcVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 in_RDX;
  string_view sVar5;
  string_view sVar6;
  size_t value_pos;
  string_view dvalue;
  string_view enumerator;
  string_view name;
  IntegerToHex hex;
  char underlying_type_tag;
  undefined8 in_stack_fffffffffffffe68;
  undefined2 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  char c;
  string_view *in_stack_fffffffffffffe80;
  string_view *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffea0;
  string_view *in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffec0;
  char *pcVar8;
  string_view *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  ToStringVisitor *pTStack_118;
  Range *local_108;
  string_view local_e0;
  Range *in_stack_ffffffffffffff30;
  IntegerToHex *in_stack_ffffffffffffff38;
  undefined1 local_c0 [16];
  size_t sStack_b8;
  IntegerToHex local_b0;
  char local_8e;
  undefined1 local_8d;
  string local_40 [40];
  undefined8 local_18;
  string_view local_10;
  
  uVar7 = (undefined2)((ulong)in_stack_fffffffffffffe68 >> 0x30);
  local_18 = in_RDX;
  string_view::remove_prefix(&local_10,1);
  string_view::remove_suffix(&local_10,1);
  bVar1 = string_view::empty(&local_10);
  if (!bVar1) {
    pcVar2 = string_view::operator[](&local_10,0);
    c = (char)((ulong)in_stack_fffffffffffffe78 >> 0x38);
    local_8e = *pcVar2;
    IntegerToHex::IntegerToHex(&local_b0);
    visit_arithmetic<mserialize::detail::IntegerToHex,binlog::Range>
              (local_c0[7],in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    string_view::remove_prefix(&local_10,2);
    sVar5 = remove_prefix_before(in_stack_fffffffffffffe80,c);
    string_view::string_view((string_view *)&stack0xffffffffffffff30);
    local_e0 = IntegerToHex::delimited_value
                         ((IntegerToHex *)in_stack_fffffffffffffe70,(char)((ushort)uVar7 >> 8),
                          (char)uVar7);
    sVar6._len = in_stack_fffffffffffffed8;
    sVar6._ptr = in_stack_fffffffffffffed0;
    sVar3 = string_view::find(in_stack_fffffffffffffec8,sVar6,in_stack_fffffffffffffec0);
    if (sVar3 != 0xffffffffffffffff) {
      sVar4 = string_view::size(&local_e0);
      string_view::remove_prefix(&local_10,(sVar3 + sVar4) - 1);
      sVar6 = tag_pop_label(in_stack_fffffffffffffe90);
      local_108 = (Range *)sVar6._ptr;
      in_stack_fffffffffffffeb0 = sVar3;
      in_stack_ffffffffffffff30 = local_108;
    }
    pcVar8 = sVar5._ptr;
    sStack_b8 = sVar5._len;
    sVar6 = IntegerToHex::value((IntegerToHex *)0x1f0d97);
    pTStack_118 = (ToStringVisitor *)sVar6._ptr;
    e.name._len = local_18;
    e.name._ptr = (char *)in_stack_fffffffffffffea0;
    e.enumerator._ptr = (char *)in_stack_fffffffffffffeb0;
    e.enumerator._len = in_stack_fffffffffffffeb8;
    e._32_8_ = pcVar8;
    e.value._ptr = (char *)sStack_b8;
    e.value._len = (size_t)in_stack_ffffffffffffff30;
    binlog::ToStringVisitor::visit(pTStack_118,e);
    return;
  }
  local_8d = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  string_view::to_string_abi_cxx11_(in_stack_fffffffffffffea8);
  std::operator+((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  std::runtime_error::runtime_error(this,local_40);
  local_8d = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void visit_enum(string_view tag, Visitor& visitor, InputStream& istream)
{
  tag.remove_prefix(1); // drop slash
  tag.remove_suffix(1); // drop backslash

  if (tag.empty()) { throw std::runtime_error("Invalid enum tag: '" + tag.to_string() + "'"); }

  // convert the discriminator to hex
  const char underlying_type_tag = tag[0];
  IntegerToHex hex;
  visit_arithmetic(underlying_type_tag, hex, istream);

  tag.remove_prefix(2); // drop underlying_type_tag and `
  const string_view name = remove_prefix_before(tag, '\'');

  string_view enumerator;

  const string_view dvalue = hex.delimited_value('\'', '`');
  const std::size_t value_pos = tag.find(dvalue);

  if (value_pos != string_view::npos)
  {
    tag.remove_prefix(value_pos + dvalue.size() - 1);
    enumerator = tag_pop_label(tag);
  }

  visitor.visit(mserialize::Visitor::Enum{name, enumerator, underlying_type_tag, hex.value()});
}